

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O2

int coda_data_dictionary_init(void)

{
  coda_data_dictionary *data_dictionary;
  long lVar1;
  hashtable *phVar2;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + -0x11f0) == 0) {
    data_dictionary = (coda_data_dictionary *)malloc(0x68);
    if (data_dictionary == (coda_data_dictionary *)0x0) {
      data_dictionary = (coda_data_dictionary *)0x0;
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x68,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                     ,0x398);
    }
    else {
      data_dictionary->num_product_classes = 0;
      data_dictionary->product_class = (coda_product_class **)0x0;
      for (lVar1 = 3; lVar1 != 0xd; lVar1 = lVar1 + 1) {
        data_dictionary->detection_tree[lVar1 + -3] = (coda_detection_node *)0x0;
      }
      phVar2 = coda_hashtable_new(1);
      data_dictionary->hash_data = phVar2;
      if (phVar2 == (hashtable *)0x0) {
        coda_set_error(-1,"out of memory (could not create hashtable) (%s:%u)",
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                       ,0x3a7);
        delete_data_dictionary(data_dictionary);
        data_dictionary = (coda_data_dictionary *)0x0;
      }
    }
    *(coda_data_dictionary **)(in_FS_OFFSET + -0x11f0) = data_dictionary;
    return -(uint)(data_dictionary == (coda_data_dictionary *)0x0);
  }
  __assert_fail("coda_global_data_dictionary == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                ,0x4b0,"int coda_data_dictionary_init(void)");
}

Assistant:

int coda_data_dictionary_init(void)
{
    assert(coda_global_data_dictionary == NULL);

    coda_global_data_dictionary = coda_data_dictionary_new();
    if (coda_global_data_dictionary == NULL)
    {
        return -1;
    }

    return 0;
}